

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

size_t Catch::listTags(Config *config)

{
  pointer *this;
  string *psVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar5;
  ReusableStringStream *this_00;
  ostream *poVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  char *pcVar9;
  string *s;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar10;
  undefined1 local_178 [8];
  _Rb_tree_node_base _Stack_170;
  size_t local_150;
  size_t sStack_148;
  pointer local_138;
  pointer local_130;
  ReusableStringStream rss;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  string lcaseTagName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  Column wrapper;
  string local_50;
  
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  iVar4 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  pcVar9 = "All available tags:\n";
  if ((char)iVar4 != '\0') {
    pcVar9 = "Tags for matching test cases:\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar9);
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tagCounts._M_t._M_impl.super__Rb_tree_header._M_header;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests(&matchedTestCases,testCases,(TestSpec *)CONCAT44(extraout_var,iVar3),
              &config->super_IConfig);
  local_138 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  while (matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
         _M_impl.super__Vector_impl_data._M_start != local_138) {
    psVar1 = ((matchedTestCases.
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
               super__Vector_impl_data._M_start)->super_TestCaseInfo).tags.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_130 = matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start;
    for (s = ((matchedTestCases.
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
               super__Vector_impl_data._M_start)->super_TestCaseInfo).tags.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; s != psVar1; s = s + 1) {
      toLower(&lcaseTagName,s);
      iVar5 = clara::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                      *)&tagCounts,&lcaseTagName);
      if ((_Rb_tree_header *)iVar5._M_node == &tagCounts._M_t._M_impl.super__Rb_tree_header) {
        _Stack_170._M_parent = (_Base_ptr)0x0;
        local_178 = (undefined1  [8])0x0;
        _Stack_170._0_8_ = (pointer)0x0;
        _Stack_170._M_left = &_Stack_170;
        local_150 = 0;
        sStack_148 = 0;
        _Stack_170._M_right = _Stack_170._M_left;
        clara::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Catch::TagInfo,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                    *)&wrapper,&lcaseTagName,(TagInfo *)local_178);
        pVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                 ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                             *)&tagCounts,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                             *)&wrapper);
        iVar5._M_node = (_Base_ptr)pVar10.first._M_node;
        clara::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)&wrapper);
        clara::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_178);
      }
      TagInfo::add((TagInfo *)(iVar5._M_node + 2),s);
      std::__cxx11::string::~string((string *)&lcaseTagName);
    }
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start = local_130 + 1;
  }
  for (p_Var8 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar2 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count,
      (_Rb_tree_header *)p_Var8 != &tagCounts._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
    ReusableStringStream::ReusableStringStream(&rss);
    std::operator<<((ostream *)rss.m_oss,"  ");
    *(undefined8 *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x10) = 2;
    this_00 = ReusableStringStream::operator<<(&rss,(unsigned_long *)&p_Var8[3]._M_left);
    ReusableStringStream::operator<<(this_00,(char (*) [3])0x1b0101);
    std::__cxx11::stringbuf::str();
    TagInfo::all_abi_cxx11_(&local_50,(TagInfo *)(p_Var8 + 2));
    clara::TextFlow::Column::Column((Column *)local_178,&local_50);
    local_150 = 0;
    _Stack_170._M_right = (_Base_ptr)lcaseTagName._M_string_length;
    _Stack_170._M_left = (_Rb_tree_node_base *)0x46;
    clara::TextFlow::Column::Column(&wrapper,(Column *)local_178);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    std::__cxx11::string::~string((string *)&local_50);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&lcaseTagName);
    poVar7 = clara::TextFlow::operator<<((ostream *)poVar6,&wrapper);
    std::operator<<((ostream *)poVar7,'\n');
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&wrapper.m_strings);
    std::__cxx11::string::~string((string *)&lcaseTagName);
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"tag",(allocator<char> *)&lcaseTagName);
  this = &wrapper.m_strings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  wrapper.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar2;
  std::__cxx11::string::string((string *)this,(string *)local_178);
  operator<<((ostream *)&std::cout,(pluralise *)&wrapper);
  poVar6 = std::operator<<((ostream *)&std::cout,'\n');
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)local_178);
  sVar2 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree(&tagCounts._M_t);
  return sVar2;
}

Assistant:

std::size_t listTags( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCase : matchedTestCases ) {
            for( auto const& tagName : testCase.getTestCaseInfo().tags ) {
                std::string lcaseTagName = toLower( tagName );
                auto countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( auto const& tagCount : tagCounts ) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.second.count << "  ";
            auto str = rss.str();
            auto wrapper = Column( tagCount.second.all() )
                                                    .initialIndent( 0 )
                                                    .indent( str.size() )
                                                    .width( CATCH_CONFIG_CONSOLE_WIDTH-10 );
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << '\n' << std::endl;
        return tagCounts.size();
    }